

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_prim.c
# Opt level: O2

void LowPrimitives(int mode)

{
  ushort uVar1;
  char cVar2;
  ushort uVar3;
  char cVar4;
  undefined8 in_RSI;
  long lVar5;
  long lVar6;
  char cVar7;
  ushort uVar8;
  float fVar9;
  float fVar10;
  undefined8 uVar11;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  
  if (mode == 2) {
    al_set_blender(0,1,Blend != 0);
    al_use_transform(&MainTrans);
    al_draw_prim(LowPrimitives::vtx,0,0,0,4,0);
    al_draw_prim(LowPrimitives::vtx,0,0,4,9,1);
    al_draw_prim(LowPrimitives::vtx,0,0,9,0xd,2);
    al_draw_prim(LowPrimitives::vtx2,0,0,0,0xd,6);
    al_use_transform(&Identity);
    return;
  }
  if (mode != 1) {
    if (mode == 0) {
      cVar2 = -0x80;
      uVar3 = 2;
      lVar5 = 0x1c;
      cVar4 = '@';
      uVar8 = 1;
      cVar7 = '\0';
      lVar6 = 0;
      while( true ) {
        uVar1 = (ushort)lVar6;
        if (lVar6 == 0xd) break;
        fVar9 = (float)(int)lVar6 / 13.0;
        fVar9 = (fVar9 + fVar9) * 3.1415927;
        fVar10 = cosf(fVar9);
        fVar9 = sinf(fVar9);
        lVar6 = lVar6 + 1;
        uVar11 = al_map_rgb((char)(uVar8 / 3) * '@' + cVar4,(char)(uVar3 / 3) * '@' + cVar2,
                            (char)((uVar1 & 0xff) / 3) * '@' + cVar7);
        *(ulong *)((long)MainTrans.m[3] + lVar5) = CONCAT44(fVar9 * 200.0,fVar10 * 200.0);
        *(undefined4 *)((long)MainTrans.m[3] + lVar5 + 8) = 0;
        *(ulong *)((long)&LowPrimitives::vtx[0xc].color.r + lVar5) =
             CONCAT44(fVar9 * 200.0 * 0.1,fVar10 * 200.0 * 0.1);
        *(undefined8 *)(lVar5 + 0x10a4d8) = uVar11;
        *(undefined4 *)((long)&LowPrimitives::vtx[0].x + lVar5) = in_XMM1_Da;
        *(undefined4 *)((long)&LowPrimitives::vtx[0].y + lVar5) = in_XMM1_Db;
        *(undefined8 *)(lVar5 + 0x10a6b8) = uVar11;
        *(undefined4 *)((long)&LowPrimitives::vtx2[0].x + lVar5) = in_XMM1_Da;
        *(undefined4 *)((long)&LowPrimitives::vtx2[0].y + lVar5) = in_XMM1_Db;
        cVar2 = cVar2 + '@';
        uVar3 = (ushort)(byte)((char)uVar3 + 1);
        cVar7 = cVar7 + '@';
        lVar5 = lVar5 + 0x24;
        cVar4 = cVar4 + '@';
        uVar8 = (ushort)(byte)((char)uVar8 + 1);
      }
    }
    return;
  }
  Theta = Speed + Theta;
  al_build_transform((float)(ScreenW / 2),(float)(ScreenH / 2),0x3f800000,0x3f800000,&MainTrans,
                     in_RSI,(long)ScreenH % 2 & 0xffffffff);
  return;
}

Assistant:

static void LowPrimitives(int mode)
{
   static ALLEGRO_VERTEX vtx[13];
   static ALLEGRO_VERTEX vtx2[13];
   if (mode == INIT) {
      int ii = 0;
      ALLEGRO_COLOR color;
      for (ii = 0; ii < 13; ii++) {
         float x, y;
         x = 200 * cosf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         y = 200 * sinf((float)ii / 13.0f * 2 * ALLEGRO_PI);
         
         color = al_map_rgb((ii + 1) % 3 * 64, (ii + 2) % 3 * 64, (ii) % 3 * 64);
         
         vtx[ii].x = x; vtx[ii].y = y; vtx[ii].z = 0;
         vtx2[ii].x = 0.1 * x; vtx2[ii].y = 0.1 * y;
         vtx[ii].color = color;
         vtx2[ii].color = color;
      }
   } else if (mode == LOGIC) {
      Theta += Speed;
      al_build_transform(&MainTrans, ScreenW / 2, ScreenH / 2, 1, 1, Theta);
   } else if (mode == DRAW) {
      if (Blend)
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ONE);
      else
         al_set_blender(ALLEGRO_ADD, ALLEGRO_ONE, ALLEGRO_ZERO);
      
      al_use_transform(&MainTrans);
      
      al_draw_prim(vtx, 0, 0, 0, 4, ALLEGRO_PRIM_LINE_LIST);
      al_draw_prim(vtx, 0, 0, 4, 9, ALLEGRO_PRIM_LINE_STRIP);
      al_draw_prim(vtx, 0, 0, 9, 13, ALLEGRO_PRIM_LINE_LOOP);
      al_draw_prim(vtx2, 0, 0, 0, 13, ALLEGRO_PRIM_POINT_LIST);
      
      al_use_transform(&Identity);
   }
}